

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerGLSL::should_forward(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRExpression *pSVar3;
  size_t sVar4;
  bool local_51;
  uint32_t max_expression_dependencies;
  SPIRExpression *expr;
  SPIRVariable *local_28;
  SPIRVariable *var;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  var._4_4_ = id;
  pCStack_18 = this;
  local_28 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (local_28 == (SPIRVariable *)0x0) {
    if (((this->options).force_temporary & 1U) == 0) {
      pSVar3 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,var._4_4_);
      if ((pSVar3 == (SPIRExpression *)0x0) ||
         (sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::size
                            (&(pSVar3->expression_dependencies).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>),
         sVar4 < 0x40)) {
        if ((((pSVar3 == (SPIRExpression *)0x0) ||
             (uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->loaded_from),
             uVar2 == 0)) ||
            (bVar1 = Compiler::has_decoration
                               (&this->super_Compiler,(ID)(pSVar3->loaded_from).id,DecorationBuiltIn
                               ), !bVar1)) ||
           (bVar1 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(pSVar3->loaded_from).id,DecorationVolatile
                              ), !bVar1)) {
          bVar1 = Compiler::is_immutable(&this->super_Compiler,var._4_4_);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)((long)&expr + 4),var._4_4_);
    bVar1 = Compiler::has_decoration(&this->super_Compiler,expr._4_4_,DecorationBuiltIn);
    local_51 = false;
    if (bVar1) {
      TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&expr,var._4_4_);
      local_51 = Compiler::has_decoration(&this->super_Compiler,expr._0_4_,DecorationVolatile);
    }
    this_local._7_1_ = (bool)((local_51 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::should_forward(uint32_t id) const
{
	// If id is a variable we will try to forward it regardless of force_temporary check below
	// This is important because otherwise we'll get local sampler copies (highp sampler2D foo = bar) that are invalid in OpenGL GLSL

	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
	{
		// Never forward volatile builtin variables, e.g. SPIR-V 1.6 HelperInvocation.
		return !(has_decoration(id, DecorationBuiltIn) && has_decoration(id, DecorationVolatile));
	}

	// For debugging emit temporary variables for all expressions
	if (options.force_temporary)
		return false;

	// If an expression carries enough dependencies we need to stop forwarding at some point,
	// or we explode compilers. There are usually limits to how much we can nest expressions.
	auto *expr = maybe_get<SPIRExpression>(id);
	const uint32_t max_expression_dependencies = 64;
	if (expr && expr->expression_dependencies.size() >= max_expression_dependencies)
		return false;

	if (expr && expr->loaded_from
		&& has_decoration(expr->loaded_from, DecorationBuiltIn)
		&& has_decoration(expr->loaded_from, DecorationVolatile))
	{
		// Never forward volatile builtin variables, e.g. SPIR-V 1.6 HelperInvocation.
		return false;
	}

	// Immutable expression can always be forwarded.
	if (is_immutable(id))
		return true;

	return false;
}